

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O3

double fpconv_strtod(char *nptr,char **endptr)

{
  byte bVar1;
  char cVar2;
  char *__s;
  char *pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  char *endbuf;
  char localbuf [32];
  char *local_60;
  char local_58 [40];
  
  cVar2 = locale_decimal_point;
  if (locale_decimal_point == '.') {
    dVar7 = strtod(nptr,endptr);
    return dVar7;
  }
  lVar5 = 0;
  lVar6 = 0;
  while ((bVar1 = nptr[lVar5], (byte)(bVar1 - 0x30) < 10 ||
         (((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) ||
          (0xe6 < (byte)((bVar1 | 0x20) + 0x86)))))) {
    lVar6 = lVar6 + 0x100000000;
    lVar5 = lVar5 + 1;
  }
  iVar4 = (int)lVar5;
  if (iVar4 == 0) {
LAB_0013cef8:
    *endptr = nptr;
    dVar7 = 0.0;
  }
  else {
    if (iVar4 < 0x20) {
      __s = local_58;
    }
    else {
      __s = (char *)malloc((ulong)(iVar4 + 1));
      if (__s == (char *)0x0) {
        fpconv_strtod_cold_1();
        goto LAB_0013cef8;
      }
    }
    memcpy(__s,nptr,lVar6 >> 0x20);
    __s[lVar6 >> 0x20] = '\0';
    pcVar3 = strchr(__s,0x2e);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = cVar2;
    }
    dVar7 = strtod(__s,&local_60);
    *endptr = nptr + ((long)local_60 - (long)__s);
    if (0x1f < iVar4) {
      free(__s);
    }
  }
  return dVar7;
}

Assistant:

double fpconv_strtod(const char *nptr, char **endptr)
{
    char localbuf[FPCONV_G_FMT_BUFSIZE];
    char *buf, *endbuf, *dp;
    int buflen;
    double value;

    /* System strtod() is fine when decimal point is '.' */
    if (locale_decimal_point == '.')
        return strtod(nptr, endptr);

    buflen = strtod_buffer_size(nptr);
    if (!buflen) {
        /* No valid characters found, standard strtod() return */
        *endptr = (char *)nptr;
        return 0;
    }

    /* Duplicate number into buffer */
    if (buflen >= FPCONV_G_FMT_BUFSIZE) {
        /* Handle unusually large numbers */
        buf = (char *)malloc(buflen + 1);
        if (!buf) {
            fprintf(stderr, "Out of memory");
            abort();
        }
    } else {
        /* This is the common case.. */
        buf = localbuf;
    }
    memcpy(buf, nptr, buflen);
    buf[buflen] = 0;

    /* Update decimal point character if found */
    dp = strchr(buf, '.');
    if (dp)
        *dp = locale_decimal_point;

    value = strtod(buf, &endbuf);
    *endptr = (char *)&nptr[endbuf - buf];
    if (buflen >= FPCONV_G_FMT_BUFSIZE)
        free(buf);

    return value;
}